

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_sparse.c
# Opt level: O1

void __thiscall
lu_solve_sparse(void *this,lu_int nrhs,lu_int *irhs,double *xrhs,lu_int *p_nlhs,lu_int *ilhs,
               double *xlhs,char trans)

{
  lu_int *plVar1;
  double *value;
  lu_int *marked;
  double *lhs;
  bool bVar2;
  lu_int *plVar3;
  lu_int *begin;
  lu_int lVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  lu_int *plVar14;
  double dVar15;
  lu_int Uflops;
  lu_int Lflops;
  double local_110;
  long local_108;
  lu_int *local_100;
  uint *local_f8;
  lu_int *local_f0;
  int local_e4;
  lu_int *local_e0;
  lu_int *local_d8;
  lu_int *local_d0;
  void *local_c8;
  int *local_c0;
  lu_int *local_b8;
  lu_int *local_b0;
  long local_a8;
  lu_int *local_a0;
  lu_int *local_98;
  lu_int *local_90;
  ulong local_88;
  double *local_80;
  lu_int *local_78;
  double *local_70;
  double *local_68;
  long local_60;
  long local_58;
  long local_50;
  ulong local_48;
  double *local_40;
  double *local_38;
  
  iVar5 = *(int *)((long)this + 0x54);
  local_108 = (long)iVar5;
  local_88 = (ulong)*(uint *)((long)this + 0x68);
  local_48 = (ulong)*(uint *)((long)this + 400);
  local_110 = *(double *)((long)this + 0x10);
  local_58 = *(long *)((long)this + 0x250);
  lVar9 = *(long *)((long)this + 0x260);
  local_50 = *(long *)((long)this + 0x270);
  local_60 = *(long *)((long)this + 0x200);
  local_a0 = *(lu_int **)((long)this + 0x1d8);
  local_98 = *(lu_int **)((long)this + 0x1e8);
  local_d0 = *(lu_int **)((long)this + 0x220);
  local_a8 = *(long *)((long)this + 0x240);
  local_78 = *(lu_int **)((long)this + 0x280);
  local_c0 = *(int **)((long)this + 0x1f8);
  local_38 = *(double **)((long)this + 0x2a8);
  local_70 = *(double **)((long)this + 0x2b0);
  plVar1 = *(lu_int **)((long)this + 0x1a0);
  value = *(double **)((long)this + 0x1b8);
  local_b8 = *(lu_int **)((long)this + 0x1a8);
  local_80 = *(double **)((long)this + 0x1c0);
  local_40 = *(double **)((long)this + 0x1c8);
  marked = *(lu_int **)((long)this + 0x290);
  Lflops = 0;
  Uflops = 0;
  local_e4 = (int)((double)iVar5 * *(double *)((long)this + 0x48));
  uVar7 = *(int *)((long)this + 0x18c) + 1;
  local_e0 = (lu_int *)(ulong)uVar7;
  local_f0 = *(lu_int **)((long)this + 0x210);
  lhs = *(double **)((long)this + 0x298);
  local_90 = *(lu_int **)((long)this + 0x2a0);
  *(uint *)((long)this + 0x18c) = uVar7;
  local_100 = local_f0 + local_108;
  local_f8 = (uint *)p_nlhs;
  local_d8 = ilhs;
  local_c8 = this;
  local_b0 = irhs;
  local_68 = xrhs;
  if ((trans & 0xdfU) == 0x54) {
    local_e0 = *(lu_int **)((long)this + 0x230);
    local_d0 = *(lu_int **)((long)this + 0x1b0);
    local_a0 = *(lu_int **)((long)this + 0x228);
    local_98 = *(lu_int **)((long)this + 0x218);
    lVar4 = lu_solve_symbolic(iVar5,*(lu_int **)((long)this + 0x218),
                              *(lu_int **)((long)this + 0x228),*(lu_int **)((long)this + 0x1b0),nrhs
                              ,irhs,local_f0,local_90,marked,uVar7);
    plVar14 = local_100;
    if (0 < nrhs) {
      uVar6 = 0;
      do {
        lhs[local_b0[uVar6]] = local_68[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nrhs != uVar6);
    }
    uVar7 = lu_solve_triangular((int)local_108 - lVar4,local_f0 + lVar4,local_98,local_a0,local_d0,
                                local_40,local_38,local_110,lhs,local_100,&Uflops);
    plVar3 = local_f0;
    iVar5 = *(int *)((long)local_c8 + 0x18c) + 1;
    *(int *)((long)local_c8 + 0x18c) = iVar5;
    if (0 < (int)uVar7) {
      uVar6 = 0;
      do {
        lVar10 = (long)plVar14[uVar6];
        iVar12 = *(int *)(lVar9 + lVar10 * 4);
        plVar14[uVar6] = iVar12;
        xlhs[iVar12] = lhs[lVar10];
        lhs[lVar10] = 0.0;
        marked[iVar12] = iVar5;
        uVar6 = uVar6 + 1;
      } while (uVar7 != uVar6);
    }
    if ((int)local_88 < 1) {
      iVar8 = 0;
    }
    else {
      iVar8 = 0;
      uVar6 = local_88;
      do {
        dVar15 = xlhs[*(int *)(local_60 + -4 + uVar6 * 4)];
        if (((dVar15 != 0.0) || (NAN(dVar15))) &&
           (lVar9 = (long)local_c0[uVar6 - 1], local_c0[uVar6 - 1] < local_c0[uVar6])) {
          do {
            iVar12 = plVar1[lVar9];
            if (marked[iVar12] != iVar5) {
              marked[iVar12] = iVar5;
              lVar10 = (long)(int)uVar7;
              uVar7 = uVar7 + 1;
              plVar14[lVar10] = iVar12;
            }
            xlhs[iVar12] = value[lVar9] * -dVar15 + xlhs[iVar12];
            iVar8 = iVar8 + 1;
            lVar9 = lVar9 + 1;
          } while (lVar9 < local_c0[uVar6]);
        }
        bVar2 = 1 < (long)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar2);
    }
    iVar5 = (int)local_108;
    if ((int)uVar7 <= local_e4) {
      iVar12 = *(int *)((long)local_c8 + 0x18c) + 1;
      *(int *)((long)local_c8 + 0x18c) = iVar12;
      lVar4 = lu_solve_symbolic(iVar5,local_e0,(lu_int *)0x0,plVar1,uVar7,plVar14,local_f0,local_90,
                                marked,iVar12);
      uVar7 = lu_solve_triangular(iVar5 - lVar4,plVar3 + lVar4,local_e0,(lu_int *)0x0,plVar1,value,
                                  (double *)0x0,local_110,xlhs,local_d8,&Lflops);
      goto LAB_003c26af;
    }
    if (0 < iVar5) {
      uVar7 = 0;
      lVar4 = Lflops;
      do {
        iVar5 = *(int *)(local_58 + -4 + local_108 * 4);
        dVar15 = xlhs[iVar5];
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          lVar9 = (long)*(int *)(local_a8 + (local_108 + -1) * 4);
          uVar11 = plVar1[lVar9];
          if (-1 < (int)uVar11) {
            do {
              xlhs[uVar11] = value[lVar9] * -dVar15 + xlhs[uVar11];
              lVar4 = lVar4 + 1;
              uVar11 = plVar1[lVar9 + 1];
              lVar9 = lVar9 + 1;
              Lflops = lVar4;
            } while (-1 < (int)uVar11);
          }
          if (ABS(dVar15) <= local_110) {
            xlhs[iVar5] = 0.0;
          }
          else {
            lVar9 = (long)(int)uVar7;
            uVar7 = uVar7 + 1;
            local_d8[lVar9] = iVar5;
          }
        }
        bVar2 = 1 < local_108;
        local_108 = local_108 + -1;
      } while (bVar2);
      goto LAB_003c26af;
    }
  }
  else {
    lVar4 = lu_solve_symbolic(iVar5,local_d0,(lu_int *)0x0,plVar1,nrhs,irhs,local_f0,local_90,marked
                              ,uVar7);
    iVar5 = (int)local_108 - lVar4;
    if (0 < nrhs) {
      uVar6 = 0;
      do {
        lhs[irhs[uVar6]] = local_68[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nrhs != uVar6);
    }
    plVar14 = local_f0 + lVar4;
    local_a8 = CONCAT44(local_a8._4_4_,iVar5);
    iVar5 = lu_solve_triangular(iVar5,plVar14,local_d0,(lu_int *)0x0,plVar1,value,(double *)0x0,
                                local_110,lhs,local_100,&Lflops);
    begin = local_78;
    plVar3 = local_f0;
    iVar12 = (int)local_108;
    if (iVar5 < (int)local_a8) {
      if (0 < iVar5) {
        iVar8 = 0;
        do {
          if (*plVar14 == local_100[iVar8]) {
            iVar8 = iVar8 + 1;
          }
          else {
            marked[*plVar14] = marked[*plVar14] + -1;
          }
          plVar14 = plVar14 + 1;
          lVar4 = lVar4 + 1;
        } while (iVar8 < iVar5);
      }
      if (lVar4 < iVar12) {
        lVar9 = (long)lVar4;
        do {
          marked[local_f0[lVar9]] = marked[local_f0[lVar9]] + -1;
          lVar9 = lVar9 + 1;
        } while (local_108 != lVar9);
      }
    }
    if (0 < (int)local_88) {
      iVar8 = *local_c0;
      uVar6 = 0;
      do {
        if (iVar8 < local_c0[uVar6 + 1]) {
          lVar9 = (long)iVar8;
          dVar15 = 0.0;
          lVar10 = 0;
          do {
            dVar15 = dVar15 + lhs[plVar1[lVar9 + lVar10]] * value[lVar9 + lVar10];
            lVar10 = lVar10 + 1;
          } while (local_c0[uVar6 + 1] - lVar9 != lVar10);
          iVar8 = iVar8 + (int)lVar10;
        }
        else {
          dVar15 = 0.0;
        }
        iVar13 = *(int *)(local_60 + uVar6 * 4);
        lhs[iVar13] = lhs[iVar13] - dVar15;
        if (((dVar15 != 0.0) || (NAN(dVar15))) && (marked[iVar13] != (int)local_e0)) {
          marked[iVar13] = (int)local_e0;
          lVar9 = (long)iVar5;
          iVar5 = iVar5 + 1;
          local_100[lVar9] = iVar13;
        }
        uVar6 = uVar6 + 1;
      } while (uVar6 != local_88);
    }
    iVar8 = local_c0[(int)local_88] - *local_c0;
    if (iVar5 <= local_e4) {
      iVar13 = *(int *)((long)local_c8 + 0x18c) + 1;
      *(int *)((long)local_c8 + 0x18c) = iVar13;
      lVar4 = lu_solve_symbolic(iVar12,local_78,(lu_int *)0x0,local_b8,iVar5,local_100,local_f0,
                                local_90,marked,iVar13);
      plVar1 = local_d8;
      uVar7 = lu_solve_triangular(iVar12 - lVar4,plVar3 + lVar4,begin,(lu_int *)0x0,local_b8,
                                  local_80,local_70,local_110,lhs,local_d8,&Uflops);
      if (0 < (int)uVar7) {
        uVar6 = 0;
        do {
          lVar9 = (long)plVar1[uVar6];
          iVar5 = *(int *)(local_50 + lVar9 * 4);
          plVar1[uVar6] = iVar5;
          xlhs[iVar5] = lhs[lVar9];
          lhs[lVar9] = 0.0;
          uVar6 = uVar6 + 1;
        } while (uVar7 != uVar6);
      }
      goto LAB_003c26af;
    }
    if (0 < (int)local_48) {
      uVar7 = 0;
      lVar4 = Uflops;
      do {
        iVar5 = *(int *)((long)local_98 + -4 + local_48 * 4);
        dVar15 = lhs[iVar5];
        if ((dVar15 != 0.0) || (NAN(dVar15))) {
          iVar12 = *(int *)((long)local_a0 + -4 + local_48 * 4);
          dVar15 = dVar15 / local_70[iVar5];
          lhs[iVar5] = 0.0;
          lVar9 = (long)local_78[iVar5];
          uVar11 = local_b8[lVar9];
          if (-1 < (int)uVar11) {
            do {
              lhs[uVar11] = local_80[lVar9] * -dVar15 + lhs[uVar11];
              lVar4 = lVar4 + 1;
              uVar11 = local_b8[lVar9 + 1];
              lVar9 = lVar9 + 1;
              Uflops = lVar4;
            } while (-1 < (int)uVar11);
          }
          if (local_110 < ABS(dVar15)) {
            lVar9 = (long)(int)uVar7;
            uVar7 = uVar7 + 1;
            local_d8[lVar9] = iVar12;
            xlhs[iVar12] = dVar15;
          }
        }
        bVar2 = 1 < (long)local_48;
        local_48 = local_48 - 1;
      } while (bVar2);
      goto LAB_003c26af;
    }
  }
  uVar7 = 0;
LAB_003c26af:
  *local_f8 = uVar7;
  *(int *)((long)local_c8 + 0xe0) = *(int *)((long)local_c8 + 0xe0) + Lflops;
  *(int *)((long)local_c8 + 0xe4) = *(int *)((long)local_c8 + 0xe4) + Uflops;
  *(int *)((long)local_c8 + 0xe8) = *(int *)((long)local_c8 + 0xe8) + iVar8;
  *(double *)((long)local_c8 + 0xa0) = (double)iVar8 + *(double *)((long)local_c8 + 0xa0);
  return;
}

Assistant:

void lu_solve_sparse(
    struct lu *this, const lu_int nrhs, const lu_int *irhs, const double *xrhs,
    lu_int *p_nlhs, lu_int *ilhs, double *xlhs, char trans)
{
    const lu_int m                  = this->m;
    const lu_int nforrest           = this->nforrest;
    const lu_int pivotlen           = this->pivotlen;
    const lu_int nz_sparse          = this->sparse_thres * m;
    const double droptol            = this->droptol;
    const lu_int *p                 = this->p;
    const lu_int *pmap              = this->pmap;
    const lu_int *qmap              = this->qmap;
    const lu_int *eta_row           = this->eta_row;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin            = this->Lbegin;
    const lu_int *Ltbegin           = this->Ltbegin;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const lu_int *Rbegin            = this->Rbegin;
    const lu_int *Wbegin            = this->Wbegin;
    const lu_int *Wend              = this->Wend;
    const double *col_pivot         = this->col_pivot;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    const lu_int *Windex            = this->Windex;
    const double *Wvalue            = this->Wvalue;
    lu_int *marked                  = this->marked;

    lu_int i, j, k, n, t, top, pos, ipivot, jpivot, nz, nz_symb, M;
    double x;

    lu_int Lflops = 0, Uflops = 0, Rflops = 0;

    if (trans == 't' || trans == 'T')
    {
        /* ----------------------- */
        /* Solve transposed system */
        /* ----------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with U'.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Wbegin, Wend, Windex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Wbegin, Wend,
                                 Windex, Wvalue, col_pivot, droptol, work,
                                 pattern, &Uflops);

        /*
         * Permute solution into xlhs.
         * Map pattern from column indices to row indices.
         */
        M = ++this->marker;
        for (n = 0; n < nz; n++)
        {
            j = pattern[n];
            i = pmap[j];
            pattern[n] = i;
            xlhs[i] = work[j];
            work[j] = 0;
            marked[i] = M;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        for (t = nforrest-1; t >= 0; t--)
        {
            ipivot = eta_row[t];
            if (xlhs[ipivot])
            {
                x = xlhs[ipivot];
                for (pos = Rbegin[t]; pos < Rbegin[t+1]; pos++)
                {
                    i = Lindex[pos];
                    if (marked[i] != M)
                    {
                        marked[i] = M;
                        pattern[nz++] = i;
                    }
                    xlhs[i] -= x * Lvalue[pos];
                    Rflops++;
                }
            }
        }

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ltbegin, NULL, Lindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ltbegin, NULL,
                                      Lindex, Lvalue, NULL, droptol, xlhs, ilhs,
                                      &Lflops);
            *p_nlhs = nz;
        }
        else
        {
            /*
             * Sequential triangular solve with L'.
             * Solution scattered into xlhs, indices in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = m-1; k >= 0; k--)
            {
                ipivot = p[k];
                if (xlhs[ipivot])
                {
                    x = xlhs[ipivot];
                    for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
                    {
                        xlhs[i] -= x * Lvalue[pos];
                        Lflops++;
                    }
                    if (fabs(x) > droptol)
                        ilhs[nz++] = ipivot;
                    else
                        xlhs[ipivot] = 0.0;
                }
            }
            *p_nlhs = nz;
        }
    }
    else
    {
        /* -------------------- */
        /* Solve forward system */
        /* -------------------- */

        lu_int *pattern_symb = this->iwork1;
        lu_int *pattern      = this->iwork1 + m;
        double *work         = this->work0;
        lu_int *pstack       = (void *) this->work1;
        assert(sizeof(lu_int) <= sizeof(double));

        /*
         * Sparse triangular solve with L.
         * Solution scattered into work, indices in pattern[0..nz-1].
         */
        M = ++this->marker;
        top = lu_solve_symbolic(m, Lbegin, NULL, Lindex, nrhs, irhs,
                                pattern_symb, pstack, marked, M);
        nz_symb = m-top;

        for (n = 0; n < nrhs; n++)
            work[irhs[n]] = xrhs[n];
        nz = lu_solve_triangular(nz_symb, pattern_symb+top, Lbegin, NULL,
                                 Lindex, Lvalue, NULL, droptol, work, pattern,
                                 &Lflops);

        /* unmark cancellation */
        if (nz < nz_symb)
        {
            for (t = top, n = 0; n < nz; t++)
            {
                i = pattern_symb[t];
                if (i == pattern[n])
                    n++;
                else
                    marked[i]--;
            }
            for ( ; t < m; t++)
                marked[pattern_symb[t]]--;
        }

        /*
         * Solve with update etas.
         * Append fill-in to pattern.
         */
        pos = Rbegin[0];
        for (t = 0; t < nforrest; t++)
        {
            ipivot = eta_row[t];
            x = 0.0;
            for ( ; pos < Rbegin[t+1]; pos++)
            {
                x += work[Lindex[pos]] * Lvalue[pos];
            }
            work[ipivot] -= x;
            if (x && marked[ipivot] != M)
            {
                marked[ipivot] = M;
                pattern[nz++] = ipivot;
            }
        }
        Rflops += Rbegin[nforrest] - Rbegin[0];

        if (nz <= nz_sparse)
        {
            /*
             * Sparse triangular solve with U.
             * Solution scattered into work, indices in ilhs[0..nz-1].
             */
            M = ++this->marker;
            top = lu_solve_symbolic(m, Ubegin, NULL, Uindex, nz, pattern,
                                    pattern_symb, pstack, marked, M);
            nz_symb = m-top;

            nz = lu_solve_triangular(nz_symb, pattern_symb+top, Ubegin, NULL,
                                     Uindex, Uvalue, row_pivot, droptol, work,
                                     ilhs, &Uflops);

            /*
             * Permute solution into xlhs.
             * Map pattern from row indices to column indices.
             */
            for (n = 0; n < nz; n++)
            {
                i = ilhs[n];
                j = qmap[i];
                ilhs[n] = j;
                xlhs[j] = work[i];
                work[i] = 0;
            }
        }
        else
        {
            /*
             * Sequential triangular solve with U.
             * Solution computed in work and permuted into xlhs.
             * Pattern (in column indices) stored in ilhs[0..nz-1].
             */
            nz = 0;
            for (k = pivotlen-1; k >= 0; k--)
            {
                ipivot = pivotrow[k];
                jpivot = pivotcol[k];
                if (work[ipivot])
                {
                    x = work[ipivot] / row_pivot[ipivot];
                    work[ipivot] = 0.0;
                    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
                    {
                        work[i] -= x * Uvalue[pos];
                        Uflops++;
                    }
                    if (fabs(x) > droptol)
                    {
                        ilhs[nz++] = jpivot;
                        xlhs[jpivot] = x;
                    }
                }
            }
        }
        *p_nlhs = nz;
    }

    this->Lflops += Lflops;
    this->Uflops += Uflops;
    this->Rflops += Rflops;
    this->update_cost_numer += Rflops;
}